

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status wal_itr_init(filemgr *file,snap_handle *shandle,bool by_key,wal_iterator **wal_iterator)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *in_RCX;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  wal_iterator *wal_itr;
  fdb_status local_4;
  
  puVar1 = (undefined8 *)malloc(0x50);
  if (puVar1 == (undefined8 *)0x0) {
    local_4 = FDB_RESULT_ALLOC_FAIL;
  }
  else {
    if ((in_DL & 1) == 0) {
      if (*(char *)(*(long *)(in_RDI + 0x110) + 0x11) != '\x01') {
        return FDB_RESULT_INVALID_CONFIG;
      }
      puVar1[2] = *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x40);
      avl_init((avl_tree *)(puVar1 + 5),(void *)0x0);
      *(undefined1 *)(puVar1 + 4) = 0;
    }
    else {
      puVar1[2] = *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x38);
      avl_init((avl_tree *)(puVar1 + 5),(void *)(in_RSI + 0xa0));
      *(undefined1 *)(puVar1 + 4) = 1;
    }
    if (*(long *)(in_RSI + 0xb8) == 0) {
      *(undefined1 *)((long)puVar1 + 0x21) = 0;
    }
    else {
      *(undefined1 *)((long)puVar1 + 0x21) = 1;
    }
    puVar1[7] = 0;
    puVar1[8] = 0;
    puVar1[3] = *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x48);
    if ((*(byte *)(in_RSI + 0x33) & 1) == 0) {
      pvVar2 = calloc(puVar1[3],0x30);
      puVar1[9] = pvVar2;
    }
    else {
      puVar1[9] = 0;
    }
    puVar1[1] = in_RSI;
    *puVar1 = *(undefined8 *)(in_RDI + 0x48);
    *(undefined1 *)((long)puVar1 + 0x22) = 0;
    *in_RCX = puVar1;
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

fdb_status wal_itr_init(struct filemgr *file,
                        struct snap_handle *shandle,
                        bool by_key,
                        struct wal_iterator **wal_iterator)
{
    struct wal_iterator *wal_itr = (struct wal_iterator *)
                      malloc(sizeof(struct wal_iterator));
    if (!wal_itr) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    // If key_cmp_info is non-null it implies key-range iteration
    if (by_key) {
        wal_itr->map_shards = file->wal->key_shards;
        avl_init(&wal_itr->merge_tree, &shandle->cmp_info);
        wal_itr->by_key = true;
    } else {
        // Otherwise wal iteration is requested over sequence range
        if (file->config->seqtree_opt != FDB_SEQTREE_USE) {
            return FDB_RESULT_INVALID_CONFIG;
        }
        wal_itr->map_shards = file->wal->seq_shards;
        avl_init(&wal_itr->merge_tree, NULL);
        wal_itr->by_key = false;
    }

    if (shandle->cmp_info.kvs) {
        wal_itr->multi_kvs = true;
    } else {
        wal_itr->multi_kvs = false;
    }
    wal_itr->cursor_pos = NULL;
    wal_itr->item_prev = NULL;

    wal_itr->num_shards = file->wal->num_shards;
    if (!shandle->is_persisted_snapshot) {
        wal_itr->cursors = (struct wal_cursor *)calloc(wal_itr->num_shards,
                           sizeof(struct wal_cursor));
    } else {
        wal_itr->cursors = NULL;
    }
    wal_itr->shandle = shandle;
    wal_itr->_wal = file->wal;
    wal_itr->direction = FDB_ITR_DIR_NONE;
    *wal_iterator = wal_itr;
    return FDB_RESULT_SUCCESS;
}